

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O0

UBool charIterTextAccess(UText *ut,int64_t index,UBool forward)

{
  long *plVar1;
  bool bVar2;
  UChar UVar3;
  int iVar4;
  bool local_42;
  int local_40;
  UBool success;
  int i;
  UBool needChunkSetup;
  UChar *buf;
  int32_t neededIndex;
  int32_t clippedIndex;
  CharacterIterator *ci;
  UBool forward_local;
  int64_t index_local;
  UText *ut_local;
  
  plVar1 = (long *)ut->context;
  buf._4_4_ = (int)index;
  if (buf._4_4_ < 0) {
    buf._4_4_ = 0;
  }
  else if (ut->a <= (long)buf._4_4_) {
    buf._4_4_ = (int)ut->a;
  }
  buf._0_4_ = buf._4_4_;
  if ((forward == '\0') && (0 < buf._4_4_)) {
    buf._0_4_ = buf._4_4_ + -1;
  }
  else if ((forward != '\0') && (((long)buf._4_4_ == ut->a && (0 < buf._4_4_)))) {
    buf._0_4_ = buf._4_4_ + -1;
  }
  iVar4 = (int)buf - (int)buf % 0x10;
  _i = (UChar *)0x0;
  bVar2 = true;
  if (ut->chunkNativeStart == (long)iVar4) {
    bVar2 = false;
  }
  else if (ut->b == iVar4) {
    _i = (UChar *)ut->p;
  }
  else if (ut->c == iVar4) {
    _i = (UChar *)ut->q;
  }
  else {
    _i = (UChar *)ut->p;
    if ((UChar *)ut->p == ut->chunkContents) {
      _i = (UChar *)ut->q;
    }
    (**(code **)(*plVar1 + 0x78))(plVar1,iVar4);
    for (local_40 = 0; local_40 < 0x10; local_40 = local_40 + 1) {
      UVar3 = (**(code **)(*plVar1 + 0x28))();
      _i[local_40] = UVar3;
      if (ut->a < (long)(local_40 + iVar4)) break;
    }
  }
  if (bVar2) {
    ut->chunkContents = _i;
    ut->chunkLength = 0x10;
    ut->chunkNativeStart = (long)iVar4;
    ut->chunkNativeLimit = (long)(iVar4 + 0x10);
    if (ut->a < ut->chunkNativeLimit) {
      ut->chunkNativeLimit = ut->a;
      ut->chunkLength = (int)ut->chunkNativeLimit - (int)ut->chunkNativeStart;
    }
    ut->nativeIndexingLimit = ut->chunkLength;
  }
  ut->chunkOffset = buf._4_4_ - (int)ut->chunkNativeStart;
  if (forward == '\0') {
    local_42 = 0 < ut->chunkOffset;
  }
  else {
    local_42 = ut->chunkOffset < ut->chunkLength;
  }
  return local_42;
}

Assistant:

static UBool U_CALLCONV
charIterTextAccess(UText *ut, int64_t index, UBool  forward) {
    CharacterIterator *ci   = (CharacterIterator *)ut->context;

    int32_t clippedIndex = (int32_t)index;
    if (clippedIndex<0) {
        clippedIndex=0;
    } else if (clippedIndex>=ut->a) {
        clippedIndex=(int32_t)ut->a;
    }
    int32_t neededIndex = clippedIndex;
    if (!forward && neededIndex>0) {
        // reverse iteration, want the position just before what was asked for.
        neededIndex--;
    } else if (forward && neededIndex==ut->a && neededIndex>0) {
        // Forward iteration, don't ask for something past the end of the text.
        neededIndex--;
    }

    // Find the native index of the start of the buffer containing what we want.
    neededIndex -= neededIndex % CIBufSize;

    UChar *buf = NULL;
    UBool  needChunkSetup = TRUE;
    int    i;
    if (ut->chunkNativeStart == neededIndex) {
        // The buffer we want is already the current chunk.
        needChunkSetup = FALSE;
    } else if (ut->b == neededIndex) {
        // The first buffer (buffer p) has what we need.
        buf = (UChar *)ut->p;
    } else if (ut->c == neededIndex) {
        // The second buffer (buffer q) has what we need.
        buf = (UChar *)ut->q;
    } else {
        // Neither buffer already has what we need.
        // Load new data from the character iterator.
        // Use the buf that is not the current buffer.
        buf = (UChar *)ut->p;
        if (ut->p == ut->chunkContents) {
            buf = (UChar *)ut->q;
        }
        ci->setIndex(neededIndex);
        for (i=0; i<CIBufSize; i++) {
            buf[i] = ci->nextPostInc();
            if (i+neededIndex > ut->a) {
                break;
            }
        }
    }

    // We have a buffer with the data we need.
    // Set it up as the current chunk, if it wasn't already.
    if (needChunkSetup) {
        ut->chunkContents = buf;
        ut->chunkLength   = CIBufSize;
        ut->chunkNativeStart = neededIndex;
        ut->chunkNativeLimit = neededIndex + CIBufSize;
        if (ut->chunkNativeLimit > ut->a) {
            ut->chunkNativeLimit = ut->a;
            ut->chunkLength  = (int32_t)(ut->chunkNativeLimit)-(int32_t)(ut->chunkNativeStart);
        }
        ut->nativeIndexingLimit = ut->chunkLength;
        U_ASSERT(ut->chunkOffset>=0 && ut->chunkOffset<=CIBufSize);
    }
    ut->chunkOffset = clippedIndex - (int32_t)ut->chunkNativeStart;
    UBool success = (forward? ut->chunkOffset<ut->chunkLength : ut->chunkOffset>0);
    return success;
}